

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlines.cpp
# Opt level: O0

void skiwi::inline_fl_min(asmcode *code,compiler_options *param_2)

{
  skiwi *this;
  uint64_t in_RDX;
  int local_104 [37];
  unsigned_long local_70;
  operand local_68 [2];
  operation local_60 [4];
  unsigned_long local_50;
  operand local_44 [2];
  operation local_3c;
  undefined1 local_38 [8];
  string done;
  compiler_options *param_1_local;
  asmcode *code_local;
  
  this = label;
  label = label + 1;
  done.field_2._8_8_ = param_2;
  label_to_string_abi_cxx11_((string *)local_38,this,in_RDX);
  local_3c = AND;
  local_44[1] = 9;
  local_44[0] = NUMBER;
  local_50 = 0xfffffffffffffff8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
            (code,&local_3c,local_44 + 1,local_44,&local_50);
  local_60[0] = AND;
  local_68[1] = 10;
  local_68[0] = NUMBER;
  local_70 = 0xfffffffffffffff8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
            (code,local_60,local_68 + 1,local_68,&local_70);
  local_104[0x24] = 0x43;
  local_104[0x23] = 0x43;
  local_104[0x22] = 0x19;
  local_104[0x21] = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)(local_104 + 0x24),(operand *)(local_104 + 0x23),
             (operand *)(local_104 + 0x22),local_104 + 0x21);
  local_104[0x20] = 0x43;
  local_104[0x1f] = 0x44;
  local_104[0x1e] = 0x1a;
  local_104[0x1d] = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)(local_104 + 0x20),(operand *)(local_104 + 0x1f),
             (operand *)(local_104 + 0x1e),local_104 + 0x1d);
  local_104[0x1c] = 0x5b;
  local_104[0x1b] = 0x43;
  local_104[0x1a] = 0x44;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)(local_104 + 0x1c),(operand *)(local_104 + 0x1b),
             (operand *)(local_104 + 0x1a));
  local_104[0x19] = 0x37;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)(local_104 + 0x19),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
  local_104[0x18] = 0x43;
  local_104[0x17] = 0x43;
  local_104[0x16] = 0x44;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)(local_104 + 0x18),(operand *)(local_104 + 0x17),
             (operand *)(local_104 + 0x16));
  local_104[0x15] = 0x3e;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)(local_104 + 0x15),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
  local_104[0x14] = 0x40;
  local_104[0x13] = 9;
  local_104[0x12] = 0x19;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)(local_104 + 0x14),(operand *)(local_104 + 0x13),
             (operand *)(local_104 + 0x12));
  local_104[0x11] = 0x40;
  local_104[0x10] = 0x20;
  local_104[0xf] = 9;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)(local_104 + 0x11),(operand *)(local_104 + 0x10),
             (operand *)(local_104 + 0xf));
  local_104[0xe] = 0x43;
  local_104[0xd] = 0x20;
  local_104[0xc] = 8;
  local_104[0xb] = 0x43;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
            (code,(operation *)(local_104 + 0xe),(operand *)(local_104 + 0xd),local_104 + 0xc,
             (operand *)(local_104 + 0xb));
  local_104[10] = 0x40;
  local_104[9] = 9;
  local_104[8] = 0x10;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)(local_104 + 10),(operand *)(local_104 + 9),
             (operand *)(local_104 + 8));
  local_104[7] = 0x49;
  local_104[6] = 9;
  local_104[5] = 0x39;
  local_104[4] = 5;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)(local_104 + 7),(operand *)(local_104 + 6),(operand *)(local_104 + 5)
             ,local_104 + 4);
  local_104[3] = 0;
  local_104[2] = 0x10;
  local_104[1] = 0x39;
  local_104[0] = 0x10;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)(local_104 + 3),(operand *)(local_104 + 2),(operand *)(local_104 + 1)
             ,local_104);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void inline_fl_min(ASM::asmcode& code, const compiler_options&)
  {
  auto done = label_to_string(label++);
  code.add(ASM::asmcode::AND, ASM::asmcode::RAX, ASM::asmcode::NUMBER, 0xFFFFFFFFFFFFFFF8);
  code.add(ASM::asmcode::AND, ASM::asmcode::RBX, ASM::asmcode::NUMBER, 0xFFFFFFFFFFFFFFF8);
  code.add(ASM::asmcode::MOVSD, ASM::asmcode::XMM0, ASM::asmcode::MEM_RAX, CELLS(1));
  code.add(ASM::asmcode::MOVSD, ASM::asmcode::XMM1, ASM::asmcode::MEM_RBX, CELLS(1));
  code.add(ASM::asmcode::UCOMISD, ASM::asmcode::XMM0, ASM::asmcode::XMM1);
  code.add(ASM::asmcode::JBS, done);
  code.add(ASM::asmcode::MOVSD, ASM::asmcode::XMM0, ASM::asmcode::XMM1);
  code.add(ASM::asmcode::LABEL, done);
  code.add(ASM::asmcode::MOV, ASM::asmcode::RAX, ASM::asmcode::MEM_RAX);
  code.add(ASM::asmcode::MOV, MEM_ALLOC, ASM::asmcode::RAX);
  code.add(ASM::asmcode::MOVSD, MEM_ALLOC, CELLS(1), ASM::asmcode::XMM0);
  code.add(ASM::asmcode::MOV, ASM::asmcode::RAX, ALLOC);
  code.add(ASM::asmcode::OR, ASM::asmcode::RAX, ASM::asmcode::NUMBER, block_tag);
  code.add(ASM::asmcode::ADD, ALLOC, ASM::asmcode::NUMBER, CELLS(2));
  }